

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void duckdb::BitStringAggOperation::
     Operation<unsigned_int,duckdb::BitAggState<unsigned_int>,duckdb::BitStringAggOperation>
               (BitAggState<unsigned_int> *state,uint *input,AggregateUnaryInput *unary_input)

{
  uint input_00;
  uint32_t uVar1;
  uint32_t max;
  FunctionData *pFVar2;
  idx_t len;
  idx_t iVar3;
  void *__src;
  BinderException *this;
  OutOfRangeException *pOVar4;
  InvalidInputException *this_00;
  allocator local_131;
  anon_union_16_2_67f50693_for_value local_130 [2];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&unary_input->input->bind_data);
  if (state->is_set == false) {
    if ((*(char *)&pFVar2[4]._vptr_FunctionData != '\0') ||
       (*(char *)&pFVar2[0xc]._vptr_FunctionData == '\x01')) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "Could not retrieve required statistics. Alternatively, try by providing the statistics explicitly: BITSTRING_AGG(col, min, max) "
                 ,&local_131);
      BinderException::BinderException(this,(string *)&local_130[0].pointer);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = Value::GetValue<unsigned_int>((Value *)(pFVar2 + 1));
    state->min = uVar1;
    uVar1 = Value::GetValue<unsigned_int>((Value *)(pFVar2 + 9));
    state->max = uVar1;
    if (uVar1 < state->min) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",&local_131);
      std::__cxx11::to_string(&local_50,state->min);
      std::__cxx11::to_string(&local_70,state->max);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (this_00,(string *)&local_130[0].pointer,&local_50,&local_70);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = Value::GetValue<unsigned_int>((Value *)(pFVar2 + 1));
    max = Value::GetValue<unsigned_int>((Value *)(pFVar2 + 9));
    len = GetRange<unsigned_int>(uVar1,max);
    if (1000000000 < len) {
      pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "The range between min and max value (%s <-> %s) is too large for bitstring aggregation"
                 ,&local_131);
      std::__cxx11::to_string(&local_90,state->min);
      std::__cxx11::to_string(&local_b0,state->max);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (pOVar4,(string *)&local_130[0].pointer,&local_90,&local_b0);
      __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = Bit::ComputeBitstringLen(len);
    local_130[0]._0_4_ = (undefined4)iVar3;
    if (0xc < iVar3) {
      __src = operator_new__(iVar3);
      if ((uint)local_130[0]._0_4_ < 0xd) {
        local_130[0]._12_4_ = 0;
        local_130[0]._4_1_ = '\0';
        local_130[0]._5_1_ = '\0';
        local_130[0]._6_1_ = '\0';
        local_130[0]._7_1_ = '\0';
        local_130[0]._8_4_ = 0;
        if (local_130[0]._0_4_ != 0) {
          switchD_00916250::default
                    (local_130[0].pointer.prefix,__src,(ulong)(local_130[0]._0_4_ & 0xf));
        }
      }
      else {
        local_130[0]._8_4_ = SUB84(__src,0);
        local_130[0]._12_4_ = (undefined4)((ulong)__src >> 0x20);
      }
    }
    Bit::SetEmptyBitString((bitstring_t *)&local_130[0].pointer,len);
    (state->value).value.pointer.length = local_130[0].pointer.length;
    *(undefined4 *)((long)&(state->value).value + 4) = local_130[0].pointer.prefix;
    *(undefined4 *)((long)&(state->value).value + 8) = local_130[0]._8_4_;
    *(undefined4 *)((long)&(state->value).value + 0xc) = local_130[0]._12_4_;
    state->is_set = true;
  }
  input_00 = *input;
  if ((state->min <= input_00) && (input_00 <= state->max)) {
    uVar1 = Value::GetValue<unsigned_int>((Value *)(pFVar2 + 1));
    Execute<unsigned_int,duckdb::BitAggState<unsigned_int>>(state,input_00,uVar1);
    return;
  }
  pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_130[0].pointer,
             "Value %s is outside of provided min and max range (%s <-> %s)",&local_131);
  std::__cxx11::to_string(&local_d0,*input);
  std::__cxx11::to_string(&local_f0,state->min);
  std::__cxx11::to_string(&local_110,state->max);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pOVar4,(string *)&local_130[0].pointer,&local_d0,&local_f0,&local_110);
  __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_agg_data = unary_input.input.bind_data->template Cast<BitstringAggBindData>();
		if (!state.is_set) {
			if (bind_agg_data.min.IsNull() || bind_agg_data.max.IsNull()) {
				throw BinderException(
				    "Could not retrieve required statistics. Alternatively, try by providing the statistics "
				    "explicitly: BITSTRING_AGG(col, min, max) ");
			}
			state.min = bind_agg_data.min.GetValue<INPUT_TYPE>();
			state.max = bind_agg_data.max.GetValue<INPUT_TYPE>();
			if (state.min > state.max) {
				throw InvalidInputException("Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",
				                            NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t bit_range =
			    GetRange(bind_agg_data.min.GetValue<INPUT_TYPE>(), bind_agg_data.max.GetValue<INPUT_TYPE>());
			if (bit_range > MAX_BIT_RANGE) {
				throw OutOfRangeException(
				    "The range between min and max value (%s <-> %s) is too large for bitstring aggregation",
				    NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t len = Bit::ComputeBitstringLen(bit_range);
			auto target = len > string_t::INLINE_LENGTH ? string_t(new char[len], UnsafeNumericCast<uint32_t>(len))
			                                            : string_t(UnsafeNumericCast<uint32_t>(len));
			Bit::SetEmptyBitString(target, bit_range);

			state.value = target;
			state.is_set = true;
		}
		if (input >= state.min && input <= state.max) {
			Execute(state, input, bind_agg_data.min.GetValue<INPUT_TYPE>());
		} else {
			throw OutOfRangeException("Value %s is outside of provided min and max range (%s <-> %s)",
			                          NumericHelper::ToString(input), NumericHelper::ToString(state.min),
			                          NumericHelper::ToString(state.max));
		}
	}